

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O2

vector<std::pair<unsigned_int,_double>,_std::allocator<std::pair<unsigned_int,_double>_>_> *
get_vps(vector<std::pair<unsigned_int,_double>,_std::allocator<std::pair<unsigned_int,_double>_>_>
        *__return_storage_ptr__,Matrix<double> *mat,uint col,uint beg_row,uint end_row)

{
  uint local_3c;
  double local_38;
  
  (__return_storage_ptr__->
  super__Vector_base<std::pair<unsigned_int,_double>,_std::allocator<std::pair<unsigned_int,_double>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<unsigned_int,_double>,_std::allocator<std::pair<unsigned_int,_double>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<unsigned_int,_double>,_std::allocator<std::pair<unsigned_int,_double>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  while ((beg_row < end_row && (beg_row < (mat->m_shape).n_row))) {
    local_3c = beg_row;
    local_38 = Matrix<double>::get(mat,beg_row,col);
    std::vector<std::pair<unsigned_int,double>,std::allocator<std::pair<unsigned_int,double>>>::
    emplace_back<unsigned_int&,double>
              ((vector<std::pair<unsigned_int,double>,std::allocator<std::pair<unsigned_int,double>>>
                *)__return_storage_ptr__,&local_3c,&local_38);
    beg_row = local_3c + 1;
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::pair<unsigned, double>> get_vps(const Matrix_d& mat, unsigned col, unsigned beg_row, unsigned end_row){
    std::vector<std::pair<unsigned, double>> vps;

    for(unsigned i=beg_row;i<mat.shape().n_row && i<end_row;++i){
        vps.emplace_back(i,mat.get(i,col));
    }

    return vps;
}